

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O0

int clip_to_short(int *x,int *y,int *w,int *h)

{
  int iVar1;
  undefined4 local_40;
  int kmax;
  int kmin;
  int lw;
  int *h_local;
  int *w_local;
  int *y_local;
  int *x_local;
  
  if (fl_line_width_ < 1) {
    local_40 = 1;
  }
  else {
    local_40 = fl_line_width_;
  }
  iVar1 = -local_40;
  local_40 = 0x7fff - local_40;
  if ((*w < 1) || (*h < 1)) {
    x_local._4_4_ = 1;
  }
  else if ((*x + *w < iVar1) || (*y + *h < iVar1)) {
    x_local._4_4_ = 1;
  }
  else if ((local_40 < *x) || (local_40 < *y)) {
    x_local._4_4_ = 1;
  }
  else {
    if (*x < iVar1) {
      *w = *w - (iVar1 - *x);
      *x = iVar1;
    }
    if (*y < iVar1) {
      *h = *h - (iVar1 - *y);
      *y = iVar1;
    }
    if (local_40 < *x + *w) {
      *w = local_40 - *x;
    }
    if (local_40 < *y + *h) {
      *h = local_40 - *y;
    }
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

static int clip_to_short(int &x, int &y, int &w, int &h) {

  int lw = (fl_line_width_ > 0) ? fl_line_width_ : 1;
  int kmin = -lw;
  int kmax = SHRT_MAX - lw;

  if (w <= 0 || h <= 0) return 1;		// (a)
  if (x+w < kmin || y+h < kmin) return 1;	// (b)
  if (x > kmax || y > kmax) return 1;		// (c)

  if (x < kmin) { w -= (kmin-x); x = kmin; }
  if (y < kmin) { h -= (kmin-y); y = kmin; }
  if (x+w > kmax) w = kmax - x;
  if (y+h > kmax) h = kmax - y;

  return 0;
}